

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_life_tokens.hpp
# Opt level: O1

void __thiscall
wigwag::life_assurance::intrusive_life_tokens::life_assurance::release_life_assurance
          (life_assurance *this,shared_data *sd)

{
  __int_type_conflict _Var1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_28;
  
  LOCK();
  (this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i =
       (this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i + 0x80000000;
  UNLOCK();
  local_28._M_device = &sd->_mutex;
  local_28._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  _Var1 = (this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i;
  while (_Var1 != 0) {
    std::condition_variable::wait((unique_lock *)sd);
    _Var1 = (this->_lock_counter_and_alive_flag).super___atomic_base<unsigned_int>._M_i;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  return;
}

Assistant:

void release_life_assurance(const shared_data& sd)
            {
                _lock_counter_and_alive_flag -= alive_flag;
                std::unique_lock<std::mutex> l(sd._mutex);
                while (_lock_counter_and_alive_flag != 0)
                    sd._cond_var.wait(l);
            }